

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_modern_cpp.h
# Opt level: O2

void __thiscall sqlite::database_binder::~database_binder(database_binder *this)

{
  bool bVar1;
  
  if (this->execution_started == false) {
    bVar1 = utility::UncaughtExceptionDetector::operator_cast_to_bool
                      (&this->_has_uncaught_exception);
    if ((!bVar1) &&
       ((this->_stmt)._M_t.super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t.
        super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
        super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl != (sqlite3_stmt *)0x0)) {
      execute(this);
    }
  }
  std::unique_ptr<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>::~unique_ptr(&this->_stmt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

~database_binder() noexcept(false) {
			/* Will be executed if no >>op is found, but not if an exception
			is in mid flight */
			if(!used() && !_has_uncaught_exception && _stmt) {
				execute();
			}
		}